

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetPropertyForTypeOfScoped<true,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,FrameDisplay *pDisplay,PropertyId propertyId,Var defaultInstance)

{
  bool bVar1;
  ScriptContext *scriptContext_00;
  Var var;
  Var errorObject_00;
  Var errorObject;
  JavascriptException *err;
  AutoCleanup autoCleanup;
  undefined1 local_60 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  JavascriptExceptionObject *exceptionObject;
  ScriptContext *scriptContext;
  Var value;
  Var defaultInstance_local;
  PropertyId propertyId_local;
  FrameDisplay *pDisplay_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  scriptContext_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  autoCatchHandlerExists.m_threadContext = (ThreadContext *)0x0;
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_60,scriptContext_00,true);
  PatchGetPropertyForTypeOfScoped<true,Js::InlineCache>(Js::FunctionBody*,Js::
  InlineCache*,unsigned_int,Js::FrameDisplay*,int,void*)::AutoCleanup::AutoCleanup(Js::
  ScriptContext__(&err,scriptContext_00);
  var = PatchGetPropertyScoped<true,Js::InlineCache>
                  (functionBody,inlineCache,inlineCacheIndex,pDisplay,propertyId,defaultInstance);
  PatchGetPropertyForTypeOfScoped<true,_Js::InlineCache>::AutoCleanup::~AutoCleanup
            ((AutoCleanup *)&err);
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_60);
  if (autoCatchHandlerExists.m_threadContext != (ThreadContext *)0x0) {
    errorObject_00 =
         JavascriptExceptionObject::GetThrownObject
                   ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                    (ScriptContext *)0x0);
    bVar1 = JavascriptError::ShouldTypeofErrorBeReThrown(errorObject_00);
    if (bVar1) {
      bVar1 = ScriptContext::IsScriptContextInDebugMode(scriptContext_00);
      if (bVar1) {
        JavascriptExceptionOperators::ThrowExceptionObject
                  ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                   scriptContext_00,true,(PVOID)0x0,false);
      }
      JavascriptExceptionOperators::DoThrowCheckClone
                ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                 scriptContext_00);
    }
  }
  bVar1 = ScriptContext::IsUndeclBlockVar(scriptContext_00,var);
  if (bVar1) {
    JavascriptError::ThrowReferenceError(scriptContext_00,-0x7ff5ec07,(PCWSTR)0x0);
  }
  return var;
}

Assistant:

Var JavascriptOperators::PatchGetPropertyForTypeOfScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyForTypeOfScoped);
        Var value = nullptr;
        ScriptContext *scriptContext = functionBody->GetScriptContext();

        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        value = JavascriptOperators::PatchGetPropertyScoped<IsFromFullJit, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, pDisplay, propertyId, defaultInstance);
        END_TYPEOF_ERROR_HANDLER(scriptContext, value)

        return value;
        JIT_HELPER_END(Op_PatchGetPropertyForTypeOfScoped);
    }